

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

void __thiscall Assimp::SMDImporter::CreateOutputAnimation(SMDImporter *this,int index,string *name)

{
  undefined8 *puVar1;
  float *pfVar2;
  double dVar3;
  char *__s;
  ulong uVar4;
  ai_uint32 aVar5;
  aiAnimation *paVar6;
  size_t sVar7;
  aiNodeAnim **ppaVar8;
  aiNodeAnim *paVar9;
  aiVectorKey *paVar10;
  ulong uVar11;
  aiQuatKey *paVar12;
  uint uVar13;
  aiQuatKey *paVar14;
  const_iterator i;
  pointer pBVar15;
  ulong uVar16;
  long lVar17;
  pointer pMVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  pointer local_a8;
  
  paVar6 = (aiAnimation *)operator_new(0x448);
  (paVar6->mName).length = 0;
  (paVar6->mName).data[0] = '\0';
  memset((paVar6->mName).data + 1,0x1b,0x3ff);
  paVar6->mDuration = -1.0;
  paVar6->mTicksPerSecond = 0.0;
  paVar6->mNumChannels = 0;
  paVar6->mChannels = (aiNodeAnim **)0x0;
  paVar6->mNumMeshChannels = 0;
  paVar6->mMeshChannels = (aiMeshAnim **)0x0;
  paVar6->mNumMorphMeshChannels = 0;
  paVar6->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  this->pScene->mAnimations[index] = paVar6;
  if (name->_M_string_length != 0) {
    __s = (name->_M_dataplus)._M_p;
    sVar7 = strlen(__s);
    aVar5 = (ai_uint32)sVar7;
    if ((int)aVar5 < 0x400) {
      (paVar6->mName).length = aVar5;
      memcpy((paVar6->mName).data,__s,(long)(int)aVar5);
      (paVar6->mName).data[(int)aVar5] = '\0';
    }
  }
  paVar6->mDuration = this->dLengthOfAnim;
  pBVar15 = (this->asBones).
            super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_a8 = (this->asBones).
             super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
             super__Vector_impl_data._M_finish;
  uVar13 = (int)((long)local_a8 - (long)pBVar15 >> 4) * 0x38e38e39;
  paVar6->mNumChannels = uVar13;
  paVar6->mTicksPerSecond = 25.0;
  ppaVar8 = (aiNodeAnim **)operator_new__((ulong)uVar13 << 3);
  paVar6->mChannels = ppaVar8;
  if (local_a8 != pBVar15) {
    uVar19 = 0;
    do {
      paVar9 = (aiNodeAnim *)operator_new(0x438);
      (paVar9->mNodeName).length = 0;
      (paVar9->mNodeName).data[0] = '\0';
      memset((paVar9->mNodeName).data + 1,0x1b,0x3ff);
      paVar9->mRotationKeys = (aiQuatKey *)0x0;
      paVar9->mNumScalingKeys = 0;
      *(undefined8 *)&paVar9->mNumPositionKeys = 0;
      *(undefined8 *)((long)&paVar9->mPositionKeys + 4) = 0;
      paVar9->mScalingKeys = (aiVectorKey *)0x0;
      paVar9->mPreState = aiAnimBehaviour_DEFAULT;
      paVar9->mPostState = aiAnimBehaviour_DEFAULT;
      ppaVar8[uVar19] = paVar9;
      uVar16 = (pBVar15->mName)._M_string_length;
      if (uVar16 < 0x400) {
        (paVar9->mNodeName).length = (ai_uint32)uVar16;
        memcpy((paVar9->mNodeName).data,(pBVar15->mName)._M_dataplus._M_p,uVar16);
        (paVar9->mNodeName).data[uVar16] = '\0';
      }
      uVar16 = ((long)(pBVar15->sAnim).asKeys.
                      super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pBVar15->sAnim).asKeys.
                      super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x3333333333333333;
      uVar13 = (uint)uVar16;
      paVar9->mNumRotationKeys = uVar13;
      if (uVar13 != 0) {
        paVar9->mNumPositionKeys = uVar13;
        uVar4 = (uVar16 & 0xffffffff) * 0x18;
        paVar10 = (aiVectorKey *)operator_new__(uVar4);
        uVar11 = 0;
        do {
          puVar1 = (undefined8 *)((long)&paVar10->mTime + uVar11);
          *puVar1 = 0;
          puVar1[1] = 0;
          *(undefined4 *)((long)&(paVar10->mValue).z + uVar11) = 0;
          uVar11 = uVar11 + 0x18;
        } while (uVar4 != uVar11);
        paVar9->mPositionKeys = paVar10;
        paVar12 = (aiQuatKey *)operator_new__((uVar16 & 0xffffffff) * 0x18);
        paVar14 = paVar12;
        do {
          paVar14->mTime = 0.0;
          (paVar14->mValue).w = 1.0;
          (paVar14->mValue).x = 0.0;
          (paVar14->mValue).y = 0.0;
          (paVar14->mValue).z = 0.0;
          paVar14 = paVar14 + 1;
        } while (paVar14 != paVar12 + (uVar16 & 0xffffffff));
        paVar9->mRotationKeys = paVar12;
        pMVar18 = (pBVar15->sAnim).asKeys.
                  super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (pMVar18 !=
            (pBVar15->sAnim).asKeys.
            super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          lVar17 = 0;
          do {
            dVar3 = pMVar18->dTime;
            *(double *)((long)&paVar10->mTime + lVar17) = dVar3;
            *(double *)((long)&paVar12->mTime + lVar17) = dVar3;
            fVar20 = (pMVar18->vRot).y * 0.5;
            fVar24 = (pMVar18->vRot).z * 0.5;
            fVar25 = (pMVar18->vRot).x * 0.5;
            fVar21 = sinf(fVar20);
            fVar20 = cosf(fVar20);
            fVar22 = sinf(fVar24);
            fVar24 = cosf(fVar24);
            fVar23 = sinf(fVar25);
            fVar25 = cosf(fVar25);
            pfVar2 = (float *)((long)&(paVar12->mValue).w + lVar17);
            *pfVar2 = fVar25 * fVar24 * fVar20 + fVar23 * fVar22 * fVar21;
            pfVar2[1] = fVar23 * fVar24 * fVar20 + -fVar25 * fVar22 * fVar21;
            pfVar2[2] = fVar24 * fVar25 * fVar21 + fVar22 * fVar23 * fVar20;
            pfVar2[3] = fVar22 * fVar25 * fVar20 + fVar24 * -fVar23 * fVar21;
            *(float *)((long)&(paVar10->mValue).z + lVar17) = (pMVar18->vPos).z;
            *(undefined8 *)((long)&(paVar10->mValue).x + lVar17) = *(undefined8 *)&pMVar18->vPos;
            pMVar18 = pMVar18 + 1;
            lVar17 = lVar17 + 0x18;
          } while (pMVar18 !=
                   (pBVar15->sAnim).asKeys.
                   super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
          local_a8 = (this->asBones).
                     super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
        }
      }
      uVar19 = (ulong)((int)uVar19 + 1);
      pBVar15 = pBVar15 + 1;
    } while (pBVar15 != local_a8);
  }
  return;
}

Assistant:

void SMDImporter::CreateOutputAnimation(int index, const std::string &name) {
    aiAnimation*& anim = pScene->mAnimations[index] = new aiAnimation();

    if (name.length()) {
        anim->mName.Set(name.c_str());
    }
    anim->mDuration = dLengthOfAnim;
    anim->mNumChannels = static_cast<unsigned int>( asBones.size() );
    anim->mTicksPerSecond = 25.0; // FIXME: is this correct?

    aiNodeAnim** pp = anim->mChannels = new aiNodeAnim*[anim->mNumChannels];

    // now build valid keys
    unsigned int a = 0;
    for (std::vector<SMD::Bone>::const_iterator i = asBones.begin(); i != asBones.end(); ++i) {
        aiNodeAnim* p = pp[a] = new aiNodeAnim();

        // copy the name of the bone
        p->mNodeName.Set(i->mName);

        p->mNumRotationKeys = (unsigned int)(*i).sAnim.asKeys.size();
        if (p->mNumRotationKeys){
            p->mNumPositionKeys = p->mNumRotationKeys;
            aiVectorKey* pVecKeys = p->mPositionKeys = new aiVectorKey[p->mNumRotationKeys];
            aiQuatKey* pRotKeys = p->mRotationKeys = new aiQuatKey[p->mNumRotationKeys];

            for (std::vector<SMD::Bone::Animation::MatrixKey>::const_iterator
                    qq = (*i).sAnim.asKeys.begin();
                    qq != (*i).sAnim.asKeys.end(); ++qq) {
                pRotKeys->mTime = pVecKeys->mTime = (*qq).dTime;

                // compute the rotation quaternion from the euler angles
                // aiQuaternion: The order of the parameters is yzx?
                pRotKeys->mValue = aiQuaternion((*qq).vRot.y, (*qq).vRot.z, (*qq).vRot.x);
                pVecKeys->mValue = (*qq).vPos;

                ++pVecKeys; ++pRotKeys;
            }
        }
        ++a;

        // there are no scaling keys ...
    }
}